

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cborinternal_p.h
# Opt level: O0

bool can_read_bytes(CborValue *it,size_t n)

{
  bool bVar1;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = qt_cbor_decoder_can_read
                    ((void *)n,CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  return bVar1;
}

Assistant:

static inline bool can_read_bytes(const CborValue *it, size_t n)
{
    if (CBOR_PARSER_READER_CONTROL >= 0) {
        if (it->parser->flags & CborParserFlag_ExternalSource || CBOR_PARSER_READER_CONTROL != 0) {
#ifdef CBOR_PARSER_CAN_READ_BYTES_FUNCTION
            return CBOR_PARSER_CAN_READ_BYTES_FUNCTION(it->source.token, n);
#else
            return it->parser->source.ops->can_read_bytes(it->source.token, n);
#endif
        }
    }

    /* Convert the pointer subtraction to size_t since end >= ptr
     * (this prevents issues with (ptrdiff_t)n becoming negative).
     */
    return (size_t)(it->parser->source.end - it->source.ptr) >= n;
}